

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MarketDataRequest.h
# Opt level: O3

void __thiscall FIX44::MarketDataRequest::NoMDEntryTypes::NoMDEntryTypes(NoMDEntryTypes *this)

{
  long *plVar1;
  atomic<long> *counter;
  message_order local_30 [8];
  undefined8 local_28;
  long *plStack_20;
  
  FIX::message_order::message_order(local_30,0x10d,0);
  FIX::FieldMap::FieldMap((FieldMap *)this,local_30);
  plVar1 = plStack_20;
  *(undefined ***)&this->super_Group = &PTR__FieldMap_00152848;
  (this->super_Group).m_field = 0x10b;
  (this->super_Group).m_delim = 0x10d;
  if (plStack_20 != (long *)0x0) {
    LOCK();
    *plStack_20 = *plStack_20 + -1;
    UNLOCK();
    if (*plStack_20 == 0) {
      local_28 = 0;
      plStack_20 = (long *)0x0;
      if (plVar1 != (long *)0x0) {
        operator_delete__(plVar1);
      }
    }
  }
  *(undefined ***)&this->super_Group = &PTR__FieldMap_00152948;
  return;
}

Assistant:

NoMDEntryTypes() : FIX::Group(267,269,FIX::message_order(269,0)) {}